

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType *
new_datatype_vector(Context_conflict *ctx,MOJOSHADER_astDataType *dt,int columns)

{
  int iVar1;
  Context_conflict *local_30;
  MOJOSHADER_astDataType *retval;
  MOJOSHADER_astDataType *pMStack_20;
  int columns_local;
  MOJOSHADER_astDataType *dt_local;
  Context_conflict *ctx_local;
  
  retval._4_4_ = columns;
  pMStack_20 = dt;
  dt_local = (MOJOSHADER_astDataType *)ctx;
  local_30 = (Context_conflict *)Malloc(ctx,0x20);
  if (local_30 == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    iVar1 = buffer_append(*(Buffer **)((long)dt_local + 0x3b8),&local_30,8);
    if (iVar1 == 0) {
      Free((Context_conflict *)&dt_local->array,local_30);
      ctx_local = (Context_conflict *)0x0;
    }
    else {
      if ((retval._4_4_ < 1) || (4 < retval._4_4_)) {
        fail((Context_conflict *)&dt_local->array,"Vector must have between 1 and 4 elements");
      }
      local_30->isfail = 0x12;
      local_30->malloc = (MOJOSHADER_malloc)pMStack_20;
      *(int *)&local_30->free = retval._4_4_;
      ctx_local = local_30;
    }
  }
  return (MOJOSHADER_astDataType *)ctx_local;
}

Assistant:

static const MOJOSHADER_astDataType *new_datatype_vector(Context *ctx,
                                            const MOJOSHADER_astDataType *dt,
                                            const int columns)
{
    MOJOSHADER_astDataType *retval;
    retval = (MOJOSHADER_astDataType *) Malloc(ctx, sizeof (*retval));
    if (retval == NULL)
        return NULL;

    // !!! FIXME: this is hacky.
    // !!! FIXME:  I'd like to cache these anyhow and reuse types.
    if (!buffer_append(ctx->garbage, &retval, sizeof (retval)))
    {
        Free(ctx, retval);
        return NULL;
    } // if

    if ((columns < 1) || (columns > 4))
        fail(ctx, "Vector must have between 1 and 4 elements");

    retval->type = MOJOSHADER_AST_DATATYPE_VECTOR;
    retval->vector.base = dt;
    retval->vector.elements = columns;
    return retval;
}